

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_deletable_handle_graph.cpp
# Opt level: O2

handle_t __thiscall
handlegraph::MutablePathDeletableHandleGraph::change_sequence
          (MutablePathDeletableHandleGraph *this,handle_t *handle,string *sequence)

{
  long lVar1;
  long lVar2;
  pointer psVar3;
  handle_t *phVar4;
  char cVar5;
  undefined8 uVar6;
  handle_t hVar7;
  pointer psVar8;
  allocator_type local_a1;
  handle_t new_handle;
  vector<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_> steps;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  handle_t *local_60;
  undefined1 local_58 [16];
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> rewriter;
  
  new_handle.data =
       (char  [8])
       (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x1d0)) + 0xa0))
                 (&this->field_0x0 + *(long *)(*(long *)this + -0x1d0),sequence);
  lVar1 = *(long *)(*(long *)this + -0xb0);
  rewriter.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)HandleGraph::forward((HandleGraph *)(&this->field_0x0 + lVar1),handle);
  local_80._M_unused._M_object = &steps;
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&new_handle;
  (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x90))
            ((HandleGraph *)(&this->field_0x0 + lVar1),&rewriter,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  lVar1 = *(long *)(*(long *)this + -0xb0);
  rewriter.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)HandleGraph::forward((HandleGraph *)(&this->field_0x0 + lVar1),handle);
  local_80._8_8_ = 0;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&new_handle;
  local_80._M_unused._M_object = &steps;
  local_68 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)handle;
  (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x90))
            ((HandleGraph *)(&this->field_0x0 + lVar1),&rewriter,1,&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  steps.super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._8_8_ = 0;
  rewriter.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&steps;
  local_68 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_80._M_unused._M_object = &rewriter;
  local_60 = handle;
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0x130))
            (&this->field_0x0 + *(long *)(*(long *)this + -0x168),handle,&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  psVar3 = steps.
           super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar8 = steps.
                super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>
                ._M_impl.super__Vector_impl_data._M_start; phVar4 = local_60, psVar8 != psVar3;
      psVar8 = psVar8 + 1) {
    lVar1 = *(long *)(*(long *)this + -0xb0);
    lVar2 = *(long *)(*(long *)this + -0x168);
    uVar6 = (**(code **)(*(long *)(&this->field_0x0 + lVar2) + 0xd8))
                      (&this->field_0x0 + lVar2,psVar8);
    local_58._0_8_ = uVar6;
    cVar5 = (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x28))
                      (&this->field_0x0 + lVar1,local_58);
    hVar7 = new_handle;
    if (cVar5 != '\0') {
      hVar7.data = (char  [8])
                   (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)) +
                               0x30))(&this->field_0x0 + *(long *)(*(long *)this + -0xb0),
                                      &new_handle);
    }
    local_80._M_unused._0_8_ = (undefined8)hVar7.data;
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
              ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
               &rewriter.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,1,
               (value_type *)&local_80,&local_a1);
    lVar1 = *(long *)(*(long *)this + -0x1c8);
    lVar2 = *(long *)(*(long *)this + -0x168);
    local_58 = (**(code **)(*(long *)(&this->field_0x0 + lVar2) + 0x118))
                         (&this->field_0x0 + lVar2,psVar8);
    (**(code **)(*(long *)(&this->field_0x0 + lVar1) + 0x188))
              (&local_80,&this->field_0x0 + lVar1,psVar8,local_58,
               &rewriter.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>);
    std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
              (&rewriter.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>);
  }
  cVar5 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)) + 0x28))
                    (&this->field_0x0 + *(long *)(*(long *)this + -0xb0),local_60);
  if (cVar5 != '\0') {
    new_handle.data =
         (char  [8])
         (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)) + 0x30))
                   (&this->field_0x0 + *(long *)(*(long *)this + -0xb0),&new_handle);
  }
  (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x1e0)) + 0xf8))
            (&this->field_0x0 + *(long *)(*(long *)this + -0x1e0),phVar4);
  std::_Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>::
  ~_Vector_base(&steps.
                 super__Vector_base<handlegraph::step_handle_t,_std::allocator<handlegraph::step_handle_t>_>
               );
  return (handle_t)new_handle.data;
}

Assistant:

handle_t MutablePathDeletableHandleGraph::change_sequence(const handle_t& handle,
                                                          const std::string& sequence) {
    // TODO: repetitive with DeletableHandleGraph, but we can't call it because it could destroy
    // all the paths containing the handle as a side effect of the destroy_handle call at the end
    
    // new handle with the new sequence
    handle_t new_handle = create_handle(sequence);
    // copy its edges
    follow_edges(forward(handle), false, [&](const handle_t& next) {
        create_edge(new_handle, next);
    });
    follow_edges(forward(handle), true, [&](const handle_t& prev) {
        // ensure that we don't double add a non-reversing self-edge
        if (get_id(prev) != get_id(handle) || get_is_reverse(prev)) {
            create_edge(prev, new_handle);
        }
    });
    
    // collect the steps we need to replace
    std::vector<step_handle_t> steps;
    for_each_step_on_handle(handle, [&](const step_handle_t& step) {
        steps.push_back(step);
    });
    
    // replace them
    for (const auto& step : steps) {
        std::vector<handle_t> rewriter(1, get_is_reverse(get_handle_of_step(step)) ? flip(new_handle) : new_handle);
        rewrite_segment(step, get_next_step(step), rewriter);
    }
    if (get_is_reverse(handle)) {
        new_handle = flip(new_handle);
    }
    
    // clear the original
    destroy_handle(handle);
    
    return new_handle;
}